

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O2

void __thiscall wabt::LoadStoreTracking::CheckLayouts(LoadStoreTracking *this)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_color _Var4;
  long lVar5;
  ulong uVar6;
  
  p_Var2 = (this->vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->vars)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    if (p_Var2[3]._M_parent == (_Base_ptr)0x1) {
LAB_0012ce62:
      *(undefined1 *)&p_Var2[3]._M_left = 0;
    }
    else {
      p_Var3 = p_Var2[2]._M_right;
      _Var4 = _S_red;
      lVar5 = 0;
      while (p_Var3 != (_Rb_tree_node_base *)&p_Var2[2]._M_parent) {
        p_Var3[2]._M_color = _Var4;
        if (p_Var3[2].field_0x4 != '\x01') goto LAB_0012ce62;
        p_Var1 = p_Var3[1]._M_parent;
        uVar6 = -(long)p_Var1 & (long)p_Var1 + lVar5 + -1;
        if (uVar6 != *(ulong *)(p_Var3 + 1)) goto LAB_0012ce62;
        lVar5 = (long)&p_Var1->_M_color + uVar6;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
        _Var4 = _Var4 + _S_black;
      }
    }
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void CheckLayouts() {
    // Here we check if the set of accesses we have collected form a sequence
    // we could declare as a struct, meaning they are properly aligned,
    // contiguous, and have no overlaps between different types and sizes.
    // We do this because an int access of size 2 at offset 0 followed by
    // a float access of size 4 at offset 4 can compactly represented as a
    // struct { short, float }, whereas something that reads from overlapping
    // or discontinuous offsets would need a more complicated syntax that
    // involves explicit offsets.
    // We assume that the bulk of memory accesses are of this very regular kind,
    // so we choose not to even emit struct layouts for irregular ones,
    // given that they are rare and confusing, and thus do not benefit from
    // being represented as if they were structs.
    for (auto& var : vars) {
      if (var.second.accesses.size() == 1) {
        // If we have just one access, this is better represented as a pointer
        // than a struct.
        var.second.struct_layout = false;
        continue;
      }
      uint64_t cur_offset = 0;
      uint32_t idx = 0;
      for (auto& access : var.second.accesses) {
        access.second.idx = idx++;
        if (!access.second.is_uniform) {
          var.second.struct_layout = false;
          break;
        }
        // Align to next access: all elements are expected to be aligned to
        // a memory address thats a multiple of their own size.
        auto mask = static_cast<uint64_t>(access.second.byte_size - 1);
        cur_offset = (cur_offset + mask) & ~mask;
        if (cur_offset != access.first) {
          var.second.struct_layout = false;
          break;
        }
        cur_offset += access.second.byte_size;
      }
    }
  }